

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O0

int ffukyg(fitsfile *fptr,char *keyname,double value,int decim,char *comm,int *status)

{
  int iVar1;
  int iVar2;
  int tstatus;
  int *status_local;
  char *comm_local;
  int decim_local;
  double value_local;
  char *keyname_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    iVar1 = *status;
    iVar2 = ffmkyg(fptr,keyname,value,decim,comm,status);
    if (iVar2 == 0xca) {
      *status = iVar1;
      ffpkyg(fptr,keyname,value,decim,comm,status);
    }
    fptr_local._4_4_ = *status;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffukyg(fitsfile *fptr,     /* I - FITS file pointer  */
           const char *keyname,/* I - keyword name       */
           double value,       /* I - keyword value      */
           int decim,          /* I - no of decimals     */
           const char *comm,   /* I - keyword comment    */
           int *status)        /* IO - error status      */
{
    int tstatus;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    tstatus = *status;

    if (ffmkyg(fptr, keyname, value, decim, comm, status) == KEY_NO_EXIST)
    {
        *status = tstatus;
        ffpkyg(fptr, keyname, value, decim, comm, status);
    }
    return(*status);
}